

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall google::protobuf::Map<long,_double>::clear(Map<long,_double> *this)

{
  iterator first;
  iterator last;
  iterator local_40;
  iterator local_28;
  Map<long,_double> *local_10;
  Map<long,_double> *this_local;
  
  local_10 = this;
  begin(&local_28,this);
  end(&local_40,this);
  first.it_.m_ = local_28.it_.m_;
  first.it_.node_ = local_28.it_.node_;
  first.it_.bucket_index_ = local_28.it_.bucket_index_;
  last.it_.m_ = local_40.it_.m_;
  last.it_.node_ = local_40.it_.node_;
  last.it_.bucket_index_ = local_40.it_.bucket_index_;
  erase(this,first,last);
  return;
}

Assistant:

void clear() { erase(begin(), end()); }